

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<FileHeader>::relocate
          (QArrayDataPointer<FileHeader> *this,qsizetype offset,FileHeader **data)

{
  bool bVar1;
  FileHeader *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  FileHeader *res;
  
  first = (FileHeader *)(*(long *)(in_RDI + 8) + in_RSI * 0x78);
  QtPrivate::q_relocate_overlap_n<FileHeader,long_long>(first,in_RDI,(FileHeader *)0x324984);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<FileHeader>,FileHeader_const*>
                        (data,(QArrayDataPointer<FileHeader> *)res), bVar1)) {
    *in_RDX = in_RSI * 0x78 + *in_RDX;
  }
  *(FileHeader **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }